

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *type;
  Message *pMVar3;
  MessageLite *this;
  LogMessage *pLVar4;
  undefined4 extraout_var_02;
  MessageLite *options_00;
  LogFinisher local_151;
  string serialized;
  LogMessage local_130;
  CodedInputStream local_f8;
  DynamicMessageFactory factory;
  undefined4 extraout_var_01;
  
  iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x11])(options);
  if (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) + 0x10) != pool) {
    iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x11])(options);
    type = DescriptorPool::FindMessageTypeByName
                     (pool,(ConstStringParam)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 8) + 0x20)
                     );
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&factory);
      pMVar3 = DynamicMessageFactory::GetPrototype(&factory,type);
      iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3,0);
      this = (MessageLite *)CONCAT44(extraout_var_01,iVar2);
      MessageLite::SerializeAsString_abi_cxx11_(&serialized,&options->super_MessageLite);
      local_f8.buffer_ = (uint8_t *)serialized._M_dataplus._M_p;
      local_f8.total_bytes_read_ = (int)serialized._M_string_length;
      local_f8.buffer_end_ =
           (uint8_t *)(serialized._M_dataplus._M_p + (int)serialized._M_string_length);
      local_f8.input_ = (ZeroCopyInputStream *)0x0;
      local_f8.overflow_bytes_ = 0;
      local_f8.last_tag_ = 0;
      local_f8.legitimate_message_end_ = false;
      local_f8.aliasing_enabled_ = false;
      local_f8.buffer_size_after_limit_ = 0;
      local_f8.total_bytes_limit_ = 0x7fffffff;
      local_f8.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
      local_f8.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
      local_f8.current_limit_ = local_f8.total_bytes_read_;
      local_f8.extension_pool_ = pool;
      local_f8.extension_factory_ = &factory.super_MessageFactory;
      bVar1 = MessageLite::ParseFromCodedStream(this,&local_f8);
      options_00 = this;
      if (!bVar1) {
        internal::LogMessage::LogMessage
                  (&local_130,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0xb62);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_130,"Found invalid proto option data for: ");
        iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x11])(options);
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,(string *)(*(long *)(CONCAT44(extraout_var_02,iVar2) + 8) + 0x20)
                           );
        internal::LogFinisher::operator=(&local_151,pLVar4);
        internal::LogMessage::~LogMessage(&local_130);
        options_00 = &options->super_MessageLite;
      }
      bVar1 = RetrieveOptionsAssumingRightPool(depth,(Message *)options_00,option_entries);
      io::CodedInputStream::~CodedInputStream(&local_f8);
      std::__cxx11::string::~string((string *)&serialized);
      (*this->_vptr_MessageLite[1])(this);
      DynamicMessageFactory::~DynamicMessageFactory(&factory);
      return bVar1;
    }
  }
  bVar1 = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  return bVar1;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<std::string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == nullptr) {
      // descriptor.proto is not in the pool. This means no custom options are
      // used so we are safe to proceed with the compiled options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    std::string serialized = options.SerializeAsString();
    io::CodedInputStream input(
        reinterpret_cast<const uint8_t*>(serialized.c_str()),
        serialized.size());
    input.SetExtensionRegistry(pool, &factory);
    if (dynamic_options->ParseFromCodedStream(&input)) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      GOOGLE_LOG(ERROR) << "Found invalid proto option data for: "
                 << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}